

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

int __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::Subst_Forward
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZFMatrix<float> *b)

{
  DecomposeType dec;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Entering Forward Substitution\n",0x1e);
  std::ostream::flush();
  dec = TPZFrontSym<float>::GetDecomposeType(&this->fFront);
  TPZStackEqnStorage<float>::Forward(&this->fStorage,b,dec);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}